

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImVec2 pos;
  ImVec2 size;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 local_40;
  ImVec2 local_38;
  
  pIVar4 = FindWindowByName(name);
  if ((pIVar4 == (ImGuiWindow *)0x0) || (pIVar4->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    auVar6._8_8_ = 0;
    auVar6._0_4_ = (viewport_p->Size).x;
    auVar6._4_4_ = (viewport_p->Size).y;
    uVar1 = *(ulong *)&viewport_p[4].Size.y;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar1;
    uVar2 = *(undefined8 *)&viewport_p[4].WorkPos.y;
    auVar6 = vsubps_avx(auVar6,auVar9);
    auVar5._0_4_ = (viewport_p->Pos).x + (float)uVar1;
    auVar5._4_4_ = (viewport_p->Pos).y + (float)(uVar1 >> 0x20);
    auVar5._8_8_ = 0;
    auVar7._0_4_ = auVar6._0_4_ + (float)uVar2;
    auVar7._4_4_ = auVar6._4_4_ + (float)((ulong)uVar2 >> 0x20);
    auVar7._8_4_ = auVar6._8_4_ + 0.0;
    auVar7._12_4_ = auVar6._12_4_ + 0.0;
    local_58 = (ImVec2)vmovlps_avx(auVar5);
    uVar1 = vcmpps_avx512vl(auVar7,ZEXT816(0) << 0x20,6);
    auVar8._0_4_ = auVar5._0_4_ + (float)((uint)((byte)uVar1 & 1) * (int)auVar7._0_4_);
    auVar8._4_4_ = auVar5._4_4_ + (float)((uint)((byte)(uVar1 >> 1) & 1) * (int)auVar7._4_4_);
    auVar8._8_4_ = (float)((uint)((byte)(uVar1 >> 2) & 1) * (int)auVar7._8_4_) + 0.0;
    auVar8._12_4_ = (float)((uint)((byte)(uVar1 >> 3) & 1) * (int)auVar7._12_4_) + 0.0;
    local_40 = vmovlps_avx(auVar8);
    if ((dir | 2U) == 3) {
      uVar1 = (ulong)((dir & 0xfffffffeU) == 2);
      (&local_58.x)[uVar1] = *(float *)((long)&local_40 + uVar1 * 4) - axis_size;
    }
    bVar3 = (dir & 0xfffffffeU) == 2;
    auVar6 = vsubps_avx(auVar8,auVar5);
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_50 = (ImVec2)vmovlps_avx(auVar6);
    (&local_50.x)[bVar3] = axis_size;
    SetNextWindowPos(&local_58,0,&local_38);
    SetNextWindowSize(&local_50,0);
    if ((dir & 0xfffffffdU) == 0) {
      (&viewport_p[4].Size.y)[bVar3] = axis_size + (&viewport_p[4].Size.y)[bVar3];
    }
    else if ((dir | 2U) == 3) {
      (&viewport_p[4].WorkPos.y)[bVar3] = (&viewport_p[4].WorkPos.y)[bVar3] - axis_size;
    }
  }
  PushStyleVar(3,0.0);
  local_48.x = 0.0;
  local_48.y = 0.0;
  PushStyleVar(5,&local_48);
  bVar3 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar3;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}